

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::lts_20250127::debugging_internal::ParseBracedExpression(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  ParseState copy;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar2 + 1;
  state->steps = iVar3 + 1;
  if (iVar3 < 0x20000 && iVar2 < 0x100) {
    uVar4 = (state->parse_state).mangled_idx;
    uVar5 = (state->parse_state).out_cur_idx;
    uVar6 = *(undefined8 *)&(state->parse_state).prev_name_idx;
    bVar7 = ParseTwoCharToken(state,"di");
    if (bVar7) {
      bVar7 = ParseSourceName(state);
      if (bVar7) {
        bVar7 = ParseBracedExpression(state);
        bVar8 = true;
        if (bVar7) goto LAB_00390f92;
      }
    }
    pPVar1 = &state->parse_state;
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
    bVar7 = ParseTwoCharToken(state,"dx");
    if (bVar7) {
      bVar7 = ParseExpression(state);
      if (bVar7) {
        bVar7 = ParseBracedExpression(state);
        bVar8 = true;
        if (bVar7) goto LAB_00390f92;
      }
    }
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
    bVar7 = ParseTwoCharToken(state,"dX");
    if (bVar7) {
      bVar7 = ParseExpression(state);
      if (bVar7) {
        bVar7 = ParseExpression(state);
        if (bVar7) {
          bVar7 = ParseBracedExpression(state);
          bVar8 = true;
          if (bVar7) goto LAB_00390f92;
        }
      }
    }
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
    bVar8 = ParseExpression(state);
  }
  else {
    bVar8 = false;
  }
LAB_00390f92:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar8;
}

Assistant:

static bool ParseBracedExpression(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  ParseState copy = state->parse_state;

  if (ParseTwoCharToken(state, "di") && ParseSourceName(state) &&
      ParseBracedExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "dx") && ParseExpression(state) &&
      ParseBracedExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "dX") &&
      ParseExpression(state) && ParseExpression(state) &&
      ParseBracedExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  return ParseExpression(state);
}